

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O3

int CfdGetDescriptorRootData
              (void *handle,void *descriptor_handle,int *script_type,char **locking_script,
              char **address,int *hash_type,char **redeem_script,int *key_type,char **pubkey,
              char **ext_pubkey,char **ext_privkey,char **schnorr_pubkey,char **tree_string,
              bool *is_multisig,uint32_t *max_key_num,uint32_t *req_sig_num)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  undefined8 uVar7;
  bool bVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  CfdException *this;
  pointer puVar13;
  char *work_tree_string;
  char *work_schnorr_pubkey;
  string addr;
  char *work_ext_pubkey;
  char *work_pubkey;
  char *work_redeem_script;
  char *work_address;
  char *work_locking_script;
  SchnorrPubkey spk;
  undefined1 local_268 [40];
  pointer local_240;
  pointer puStack_238;
  pointer local_230;
  pointer local_228;
  pointer puStack_220;
  pointer local_218;
  pointer local_210;
  pointer puStack_208;
  pointer puStack_200;
  pointer local_1f8;
  Pubkey local_1e8;
  char *local_1d0;
  char *local_1c8;
  void *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 local_198 [40];
  pointer local_170;
  pointer puStack_168;
  pointer local_160;
  pointer local_158;
  pointer puStack_150;
  pointer local_148;
  pointer local_140;
  pointer local_138;
  pointer puStack_130;
  pointer local_128;
  char **local_120;
  char **local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  SchnorrPubkey local_e8;
  ExtPubkey local_c8;
  void *local_58;
  undefined8 local_50;
  SchnorrPubkey local_48;
  
  local_f0 = (char *)0x0;
  local_f8 = (char *)0x0;
  local_100 = (char *)0x0;
  local_108 = (char *)0x0;
  local_110 = (char *)0x0;
  local_50 = 0;
  local_1a0 = (char *)0x0;
  local_1a8 = (char *)0x0;
  local_1c0 = handle;
  local_120 = address;
  local_118 = locking_script;
  cfd::Initialize();
  puVar13 = local_198 + 0x10;
  local_198._0_8_ = puVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"Descriptor","");
  cfd::capi::CheckBuffer(descriptor_handle,(string *)local_198);
  if ((pointer)local_198._0_8_ != puVar13) {
    operator_delete((void *)local_198._0_8_);
  }
  puVar3 = *(undefined8 **)((long)descriptor_handle + 0x10);
  local_58 = descriptor_handle;
  if ((puVar3 == (undefined8 *)0x0) || (piVar4 = (int *)*puVar3, piVar4 == (int *)puVar3[1])) {
    local_198._0_8_ = "cfdcapi_address.cpp";
    local_198._8_4_ = 0x1fd;
    local_198._16_8_ = "CfdGetDescriptorRootData";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_198,kCfdLogLevelWarning,"invalid script_root.");
    this = (CfdException *)__cxa_allocate_exception(0x30);
    local_198._0_8_ = puVar13;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_198,"Failed to parameter. invalid script_root.","");
    cfd::core::CfdException::CfdException(this,kCfdOutOfRangeError,(string *)local_198);
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  iVar1 = piVar4[0x70];
  if (script_type != (int *)0x0) {
    *script_type = *piVar4;
  }
  if (local_118 == (char **)0x0) {
LAB_003d6c65:
    local_1b0 = (char *)0x0;
  }
  else {
    bVar8 = cfd::core::Script::IsEmpty((Script *)(piVar4 + 2));
    if (bVar8) goto LAB_003d6c65;
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_198,(Script *)(piVar4 + 2));
    local_1b0 = cfd::capi::CreateString((string *)local_198);
    local_f0 = local_1b0;
    if ((pointer)local_198._0_8_ != puVar13) {
      operator_delete((void *)local_198._0_8_);
    }
  }
  if (local_120 == (char **)0x0) {
LAB_003d6d2b:
    local_1c8 = (char *)0x0;
  }
  else {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_198,(Address *)(piVar4 + 0x12));
    uVar7 = local_198._8_8_;
    if ((pointer)local_198._0_8_ != puVar13) {
      operator_delete((void *)local_198._0_8_);
    }
    if ((pointer)uVar7 == (pointer)0x0) goto LAB_003d6d2b;
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_198,(Address *)(piVar4 + 0x12));
    if ((pointer)local_198._8_8_ == (pointer)0x0) {
      local_1c8 = (char *)0x0;
    }
    else {
      local_1c8 = cfd::capi::CreateString((string *)local_198);
      local_f8 = local_1c8;
    }
    if ((pointer)local_198._0_8_ != puVar13) {
      operator_delete((void *)local_198._0_8_);
    }
  }
  if (hash_type != (int *)0x0) {
    *hash_type = piVar4[0x70];
  }
  if (redeem_script == (char **)0x0) {
LAB_003d6d85:
    local_1b8 = (char *)0x0;
  }
  else {
    bVar8 = cfd::core::Script::IsEmpty((Script *)(piVar4 + 0x72));
    if (bVar8) goto LAB_003d6d85;
    cfd::core::Script::GetHex_abi_cxx11_((string *)local_198,(Script *)(piVar4 + 0x72));
    local_1b8 = cfd::capi::CreateString((string *)local_198);
    local_100 = local_1b8;
    if ((pointer)local_198._0_8_ != puVar13) {
      operator_delete((void *)local_198._0_8_);
    }
  }
  if (key_type != (int *)0x0) {
    *key_type = piVar4[0x80];
  }
  cfd::core::Pubkey::Pubkey(&local_1e8);
  cfd::core::ExtPubkey::ExtPubkey(&local_c8);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_198);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_e8);
  iVar2 = piVar4[0x80];
  if (iVar2 == 2) {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)local_268,(string *)(piVar4 + 0x82));
    puVar13 = local_c8.serialize_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_c8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
    local_c8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
    local_c8.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
    local_268._0_8_ = (pointer)0x0;
    local_268._8_8_ = (pointer)0x0;
    local_268._16_8_ = (pointer)0x0;
    if (puVar13 != (pointer)0x0) {
      operator_delete(puVar13);
    }
    puVar13 = local_c8.chaincode_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_c8.version_ = local_268._24_4_;
    local_c8.fingerprint_ = local_268._28_4_;
    local_c8.depth_ = local_268[0x20];
    local_c8._33_3_ = local_268._33_3_;
    local_c8.child_num_ = local_268._36_4_;
    local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_240;
    local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_238;
    local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_230;
    local_240 = (pointer)0x0;
    puStack_238 = (pointer)0x0;
    local_230 = (pointer)0x0;
    if (puVar13 != (pointer)0x0) {
      operator_delete(puVar13);
    }
    puVar13 = local_c8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_228;
    local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_220;
    local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
    local_228 = (pointer)0x0;
    puStack_220 = (pointer)0x0;
    local_218 = (pointer)0x0;
    if (puVar13 != (pointer)0x0) {
      operator_delete(puVar13);
    }
    puVar13 = local_c8.tweak_sum_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = local_210;
    local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = puStack_208;
    local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_200;
    local_210 = (pointer)0x0;
    puStack_208 = (pointer)0x0;
    puStack_200 = (pointer)0x0;
    if ((puVar13 != (pointer)0x0) && (operator_delete(puVar13), local_210 != (pointer)0x0)) {
      operator_delete(local_210);
    }
    if (local_228 != (pointer)0x0) {
      operator_delete(local_228);
    }
    if (local_240 != (pointer)0x0) {
      operator_delete(local_240);
    }
    if ((pointer)local_268._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_268._0_8_);
    }
    cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_268,&local_c8);
LAB_003d72ae:
    puVar13 = local_1e8.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
    local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
    local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
LAB_003d72cf:
    local_268._0_8_ = (pointer)0x0;
    local_268._8_8_ = (pointer)0x0;
    local_268._16_8_ = (pointer)0x0;
    if ((puVar13 != (pointer)0x0) &&
       (operator_delete(puVar13), (pointer)local_268._0_8_ != (pointer)0x0)) {
      operator_delete((void *)local_268._0_8_);
    }
  }
  else {
    if (iVar2 == 3) {
      cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)local_268,(string *)(piVar4 + 0x82));
      uVar7 = local_198._0_8_;
      local_198._0_8_ = local_268._0_8_;
      local_198._8_8_ = local_268._8_8_;
      local_198._16_8_ = local_268._16_8_;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_268._16_8_ = (pointer)0x0;
      if ((pointer)uVar7 != (pointer)0x0) {
        operator_delete((void *)uVar7);
      }
      puVar13 = local_170;
      local_198._24_8_ = local_268._24_8_;
      local_198._32_8_ = local_268._32_8_;
      local_170 = local_240;
      puStack_168 = puStack_238;
      local_160 = local_230;
      local_240 = (pointer)0x0;
      puStack_238 = (pointer)0x0;
      local_230 = (pointer)0x0;
      if (puVar13 != (pointer)0x0) {
        operator_delete(puVar13);
      }
      puVar13 = local_158;
      local_158 = local_228;
      puStack_150 = puStack_220;
      local_148 = local_218;
      local_228 = (pointer)0x0;
      puStack_220 = (pointer)0x0;
      local_218 = (pointer)0x0;
      if (puVar13 != (pointer)0x0) {
        operator_delete(puVar13);
      }
      puVar13 = local_138;
      local_140 = local_210;
      local_138 = puStack_208;
      puStack_130 = puStack_200;
      local_128 = local_1f8;
      puStack_208 = (pointer)0x0;
      puStack_200 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      if ((puVar13 != (pointer)0x0) && (operator_delete(puVar13), puStack_208 != (pointer)0x0)) {
        operator_delete(puStack_208);
      }
      if (local_228 != (pointer)0x0) {
        operator_delete(local_228);
      }
      if (local_240 != (pointer)0x0) {
        operator_delete(local_240);
      }
      if ((pointer)local_268._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_268._0_8_);
      }
      cfd::core::ExtPrivkey::GetExtPubkey((ExtPubkey *)local_268,(ExtPrivkey *)local_198);
      puVar13 = local_c8.serialize_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
      local_c8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
      local_c8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
      local_268._0_8_ = (pointer)0x0;
      local_268._8_8_ = (pointer)0x0;
      local_268._16_8_ = (pointer)0x0;
      if (puVar13 != (pointer)0x0) {
        operator_delete(puVar13);
      }
      puVar13 = local_c8.chaincode_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8.version_ = local_268._24_4_;
      local_c8.fingerprint_ = local_268._28_4_;
      local_c8.depth_ = local_268[0x20];
      local_c8._33_3_ = local_268._33_3_;
      local_c8.child_num_ = local_268._36_4_;
      local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_240;
      local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_238;
      local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_230;
      local_240 = (pointer)0x0;
      puStack_238 = (pointer)0x0;
      local_230 = (pointer)0x0;
      if (puVar13 != (pointer)0x0) {
        operator_delete(puVar13);
      }
      puVar13 = local_c8.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start = local_228;
      local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish = puStack_220;
      local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_218;
      local_228 = (pointer)0x0;
      puStack_220 = (pointer)0x0;
      local_218 = (pointer)0x0;
      if (puVar13 != (pointer)0x0) {
        operator_delete(puVar13);
      }
      puVar13 = local_c8.tweak_sum_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = local_210;
      local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puStack_208;
      local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = puStack_200;
      local_210 = (pointer)0x0;
      puStack_208 = (pointer)0x0;
      puStack_200 = (pointer)0x0;
      if ((puVar13 != (pointer)0x0) && (operator_delete(puVar13), local_210 != (pointer)0x0)) {
        operator_delete(local_210);
      }
      if (local_228 != (pointer)0x0) {
        operator_delete(local_228);
      }
      if (local_240 != (pointer)0x0) {
        operator_delete(local_240);
      }
      if ((pointer)local_268._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_268._0_8_);
      }
      cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_268,&local_c8);
      goto LAB_003d72ae;
    }
    if (iVar2 == 4) {
      if (*(long *)(piVar4 + 0x84) == 0) goto LAB_003d72f7;
      cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_268,(string *)(piVar4 + 0x82));
      puVar13 = local_e8.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
      local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish = (pointer)local_268._8_8_;
      local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)local_268._16_8_;
      goto LAB_003d72cf;
    }
    if (*(long *)(piVar4 + 0x84) != 0) {
      cfd::core::Pubkey::Pubkey((Pubkey *)local_268,(string *)(piVar4 + 0x82));
      goto LAB_003d72ae;
    }
  }
LAB_003d72f7:
  if ((schnorr_pubkey == (char **)0x0) || (iVar1 != 7)) {
    local_1d0 = (char *)0x0;
    pcVar9 = (char *)0x0;
    if (iVar1 != 7) goto LAB_003d7498;
  }
  else {
    bVar8 = cfd::core::Pubkey::IsValid(&local_1e8);
    if (bVar8) {
      cfd::core::SchnorrPubkey::FromPubkey(&local_48,&local_1e8,(bool *)0x0);
      cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_268,&local_48);
      local_1d0 = cfd::capi::CreateString((string *)local_268);
      local_1a0 = local_1d0;
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_);
      }
      if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_003d73e3:
        operator_delete(local_48.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      bVar8 = cfd::core::SchnorrPubkey::IsValid(&local_e8);
      if (bVar8) {
        cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)local_268,&local_e8);
        local_1d0 = cfd::capi::CreateString((string *)local_268);
        local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_268._0_8_;
        local_1a0 = local_1d0;
        if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) goto LAB_003d73e3;
      }
      else {
        local_1d0 = (char *)0x0;
      }
    }
  }
  bVar8 = cfd::core::TaprootScriptTree::IsValid((TaprootScriptTree *)(piVar4 + 0xaa));
  if (bVar8) {
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_268,(TapBranch *)(piVar4 + 0xaa));
    pcVar9 = cfd::capi::CreateString((string *)local_268);
    local_1a8 = pcVar9;
    if ((undefined1 *)local_268._0_8_ == local_268 + 0x10) goto LAB_003d7498;
  }
  else {
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_268,(TapBranch *)(piVar4 + 0x8c));
    uVar7 = local_268._8_8_;
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_);
    }
    if ((pointer)uVar7 == (pointer)0x0) {
      pcVar9 = (char *)0x0;
      goto LAB_003d7498;
    }
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_268,(TapBranch *)(piVar4 + 0x8c));
    pcVar9 = cfd::capi::CreateString((string *)local_268);
    local_1a8 = pcVar9;
    if ((undefined1 *)local_268._0_8_ == local_268 + 0x10) goto LAB_003d7498;
  }
  local_1a8 = pcVar9;
  operator_delete((void *)local_268._0_8_);
LAB_003d7498:
  if ((pubkey == (char **)0x0) || (bVar8 = cfd::core::Pubkey::IsValid(&local_1e8), !bVar8)) {
    pcVar10 = (char *)0x0;
  }
  else {
    cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_268,&local_1e8);
    pcVar10 = cfd::capi::CreateString((string *)local_268);
    local_108 = pcVar10;
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_);
    }
  }
  if ((ext_pubkey == (char **)0x0) || (bVar8 = cfd::core::ExtPubkey::IsValid(&local_c8), !bVar8)) {
    pcVar11 = (char *)0x0;
  }
  else {
    cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)local_268,&local_c8);
    pcVar11 = cfd::capi::CreateString((string *)local_268);
    local_110 = pcVar11;
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_);
    }
  }
  if ((ext_privkey == (char **)0x0) ||
     (bVar8 = cfd::core::ExtPrivkey::IsValid((ExtPrivkey *)local_198), !bVar8)) {
    pcVar12 = (char *)0x0;
  }
  else {
    cfd::core::ExtPrivkey::ToString_abi_cxx11_((string *)local_268,(ExtPrivkey *)local_198);
    pcVar12 = cfd::capi::CreateString((string *)local_268);
    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
      operator_delete((void *)local_268._0_8_);
    }
  }
  if (is_multisig != (bool *)0x0) {
    lVar5 = **(long **)((long)local_58 + 0x20);
    lVar6 = (*(long **)((long)local_58 + 0x20))[1];
    *is_multisig = lVar5 != lVar6;
    if (lVar5 != lVar6) {
      *is_multisig = true;
      if (max_key_num != (uint32_t *)0x0) {
        *max_key_num = (int)((ulong)(lVar6 - lVar5) >> 3) * -0x33333333;
      }
      if (req_sig_num != (uint32_t *)0x0) {
        *req_sig_num = piVar4[0x8a];
      }
    }
  }
  if (local_1b0 != (char *)0x0) {
    *local_118 = local_1b0;
  }
  if (local_1c8 != (char *)0x0) {
    *local_120 = local_1c8;
  }
  if (local_1b8 != (char *)0x0) {
    *redeem_script = local_1b8;
  }
  if (pcVar10 != (char *)0x0) {
    *pubkey = pcVar10;
  }
  if (pcVar11 != (char *)0x0) {
    *ext_pubkey = pcVar11;
  }
  if (pcVar12 != (char *)0x0) {
    *ext_privkey = pcVar12;
  }
  if (local_1d0 != (char *)0x0) {
    *schnorr_pubkey = local_1d0;
  }
  if (pcVar9 != (char *)0x0) {
    *tree_string = pcVar9;
  }
  if (local_e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_138 != (pointer)0x0) {
    operator_delete(local_138);
  }
  if (local_158 != (pointer)0x0) {
    operator_delete(local_158);
  }
  if (local_170 != (pointer)0x0) {
    operator_delete(local_170);
  }
  if ((pointer)local_198._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._0_8_);
  }
  if (local_c8.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1e8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdGetDescriptorRootData(
    void* handle, void* descriptor_handle, int* script_type,
    char** locking_script, char** address, int* hash_type,
    char** redeem_script, int* key_type, char** pubkey, char** ext_pubkey,
    char** ext_privkey, char** schnorr_pubkey, char** tree_string,
    bool* is_multisig, uint32_t* max_key_num, uint32_t* req_sig_num) {
  int ret = CfdErrorCode::kCfdUnknownError;
  char* work_locking_script = nullptr;
  char* work_address = nullptr;
  char* work_redeem_script = nullptr;
  char* work_pubkey = nullptr;
  char* work_ext_pubkey = nullptr;
  char* work_ext_privkey = nullptr;
  char* work_schnorr_pubkey = nullptr;
  char* work_tree_string = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(descriptor_handle, kPrefixOutputDescriptor);

    CfdCapiOutputDescriptor* buffer =
        static_cast<CfdCapiOutputDescriptor*>(descriptor_handle);
    if ((buffer->script_root == nullptr) || buffer->script_root->empty()) {
      warn(CFD_LOG_SOURCE, "invalid script_root.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. invalid script_root.");
    }

    const DescriptorScriptData& desc_data = buffer->script_root->at(0);
    bool is_taproot = (desc_data.address_type == AddressType::kTaprootAddress);
    if (script_type != nullptr) *script_type = desc_data.type;
    if ((locking_script != nullptr) && (!desc_data.locking_script.IsEmpty())) {
      work_locking_script = CreateString(desc_data.locking_script.GetHex());
    }
    if ((address != nullptr) && (!desc_data.address.GetAddress().empty())) {
      std::string addr = desc_data.address.GetAddress();
      if (!addr.empty()) work_address = CreateString(addr);
    }
    if (hash_type != nullptr) {
      *hash_type = desc_data.address_type;
    }
    if ((redeem_script != nullptr) && (!desc_data.redeem_script.IsEmpty())) {
      work_redeem_script = CreateString(desc_data.redeem_script.GetHex());
    }
    if (key_type != nullptr) {
      *key_type = desc_data.key_type;
    }

    Pubkey pubkey_obj;
    ExtPubkey ext_pubkey_obj;
    ExtPrivkey ext_privkey_obj;
    SchnorrPubkey schnorr_pubkey_obj;
    switch (desc_data.key_type) {
      case DescriptorKeyType::kDescriptorKeyBip32Priv:
        ext_privkey_obj = ExtPrivkey(desc_data.key);
        ext_pubkey_obj = ext_privkey_obj.GetExtPubkey();
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeyBip32:
        ext_pubkey_obj = ExtPubkey(desc_data.key);
        pubkey_obj = ext_pubkey_obj.GetPubkey();
        break;
      case DescriptorKeyType::kDescriptorKeySchnorr:
        if (!desc_data.key.empty()) {
          schnorr_pubkey_obj = SchnorrPubkey(desc_data.key);
        }
        break;
      case DescriptorKeyType::kDescriptorKeyPublic:
      default:
        if (!desc_data.key.empty()) pubkey_obj = Pubkey(desc_data.key);
        break;
    }
    if (is_taproot && (schnorr_pubkey != nullptr)) {
      if (pubkey_obj.IsValid()) {
        auto spk = SchnorrPubkey::FromPubkey(pubkey_obj);
        work_schnorr_pubkey = CreateString(spk.GetHex());
      } else if (schnorr_pubkey_obj.IsValid()) {
        work_schnorr_pubkey = CreateString(schnorr_pubkey_obj.GetHex());
      }
    }
    if (is_taproot && desc_data.tree.IsValid()) {
      work_tree_string = CreateString(desc_data.tree.ToString());
    } else if (is_taproot && !desc_data.branch.ToString().empty()) {
      work_tree_string = CreateString(desc_data.branch.ToString());
    }
    if ((pubkey != nullptr) && (pubkey_obj.IsValid())) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }
    if ((ext_pubkey != nullptr) && (ext_pubkey_obj.IsValid())) {
      work_ext_pubkey = CreateString(ext_pubkey_obj.ToString());
    }
    if ((ext_privkey != nullptr) && (ext_privkey_obj.IsValid())) {
      work_ext_privkey = CreateString(ext_privkey_obj.ToString());
    }
    if (is_multisig != nullptr) {
      *is_multisig = !buffer->multisig_key_list->empty();
      if (!buffer->multisig_key_list->empty()) {
        *is_multisig = true;
        if (max_key_num != nullptr) {
          *max_key_num =
              static_cast<uint32_t>(buffer->multisig_key_list->size());
        }
        if (req_sig_num != nullptr) {
          *req_sig_num = static_cast<uint32_t>(desc_data.multisig_req_sig_num);
        }
      }
    }

    if (work_locking_script != nullptr) *locking_script = work_locking_script;
    if (work_address != nullptr) *address = work_address;
    if (work_redeem_script != nullptr) *redeem_script = work_redeem_script;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    if (work_ext_pubkey != nullptr) *ext_pubkey = work_ext_pubkey;
    if (work_ext_privkey != nullptr) *ext_privkey = work_ext_privkey;
    if (work_schnorr_pubkey != nullptr) *schnorr_pubkey = work_schnorr_pubkey;
    if (work_tree_string != nullptr) *tree_string = work_tree_string;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    ret = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(
      &work_locking_script, &work_address, &work_redeem_script, &work_pubkey,
      &work_ext_pubkey, &work_ext_privkey);
  FreeBufferOnError(&work_schnorr_pubkey, &work_tree_string);
  return ret;
}